

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

void convert_32s6u_C1R(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  uint uVar1;
  OPJ_INT32 OVar2;
  ulong uVar3;
  sbyte sVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  uVar3 = 0;
  if ((length & 0xfffffffffffffffc) != 0) {
    do {
      uVar7 = pSrc[uVar3 + 1];
      uVar1 = pSrc[uVar3 + 2];
      OVar2 = pSrc[uVar3 + 3];
      *pDst = (byte)(uVar7 >> 4) | (byte)(pSrc[uVar3] << 2);
      pDst[1] = (byte)(uVar1 >> 2) | (byte)(uVar7 << 4);
      pDst[2] = (byte)(uVar1 << 6) | (byte)OVar2;
      pDst = pDst + 3;
      uVar3 = uVar3 + 4;
    } while (uVar3 < (length & 0xfffffffffffffffc));
  }
  if ((length & 3) != 0) {
    uVar7 = pSrc[uVar3];
    sVar4 = 2;
    iVar5 = (int)(length & 3);
    if (iVar5 != 1) {
      uVar1 = pSrc[uVar3 + 1];
      uVar6 = 0;
      if (iVar5 == 3) {
        uVar6 = pSrc[uVar3 + 2];
      }
      *pDst = (byte)(uVar1 >> 4) | (byte)(uVar7 << 2);
      pDst[1] = (byte)(uVar6 >> 2) | (byte)(uVar1 << 4);
      if (iVar5 != 3) {
        return;
      }
      pDst = pDst + 2;
      sVar4 = 6;
      uVar7 = uVar6;
    }
    *pDst = (char)uVar7 << sVar4;
  }
  return;
}

Assistant:

static void convert_32s6u_C1R(const OPJ_INT32* pSrc, OPJ_BYTE* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	for (i = 0; i < (length & ~(OPJ_SIZE_T)3U); i+=4U) {
		OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i+0];
		OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i+1];
		OPJ_UINT32 src2 = (OPJ_UINT32)pSrc[i+2];
		OPJ_UINT32 src3 = (OPJ_UINT32)pSrc[i+3];
		
		*pDst++ = (OPJ_BYTE)((src0 << 2) | (src1 >> 4));
		*pDst++ = (OPJ_BYTE)(((src1 & 0xFU) << 4) | (src2 >> 2));
		*pDst++ = (OPJ_BYTE)(((src2 & 0x3U) << 6) | src3);
	}
	
	if (length & 3U) {
		OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i+0];
		OPJ_UINT32 src1 = 0U;
		OPJ_UINT32 src2 = 0U;
		length = length & 3U;
		
		if (length > 1U) {
			src1 = (OPJ_UINT32)pSrc[i+1];
			if (length > 2U) {
				src2 = (OPJ_UINT32)pSrc[i+2];
			}
		}
		*pDst++ = (OPJ_BYTE)((src0 << 2) | (src1 >> 4));
		if (length > 1U) {
			*pDst++ = (OPJ_BYTE)(((src1 & 0xFU) << 4) | (src2 >> 2));
			if (length > 2U) {
				*pDst++ = (OPJ_BYTE)(((src2 & 0x3U) << 6));
			}
		}
	}
}